

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O0

bool cmCMakePathCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *args,cmExecutionStatus *status)

{
  string_view key;
  initializer_list<std::pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>_>
  init;
  cmExecutionStatus *this;
  int iVar1;
  size_type sVar2;
  const_reference this_00;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_548;
  string_view local_540;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_530;
  string_view local_528;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_518;
  string_view local_510;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_500;
  string_view local_4f8;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_4e8;
  string_view local_4e0;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_4d0;
  string_view local_4c8;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_4b8;
  string_view local_4b0;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_4a0;
  string_view local_498;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_488;
  string_view local_480;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_470;
  string_view local_468;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_458;
  string_view local_450;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_440;
  string_view local_438;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_428;
  string_view local_420;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_410;
  string_view local_408;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_3f8;
  string_view local_3f0;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_3e0;
  string_view local_3d8;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_3c8;
  string_view local_3c0;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_3b0;
  string_view local_3a8;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_398;
  string_view local_390;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_380;
  string_view local_378;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_368;
  string_view local_360;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_350;
  string_view local_348;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_338;
  string_view local_330;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_320;
  string_view local_318;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_308;
  string_view local_300;
  _func_bool_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_ptr_cmExecutionStatus_ptr
  *local_2f0;
  string_view local_2e8;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_2d8;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_2c0;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_2a8;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_290;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_278;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_260;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_248;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_230;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_218;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_200;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_1e8;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_1d0;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_1b8;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_1a0;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_188;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_170;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_158;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_140;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_128;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_110;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_f8;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_e0;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_c8;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_b0;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_98;
  pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
  local_80;
  iterator local_68;
  undefined8 local_60;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  this = local_20;
  if (sVar2 < 2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"must be called with at least two arguments.",&local_41);
    cmExecutionStatus::SetError(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = false;
  }
  else {
    if (cmCMakePathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
        ::subcommand == '\0') {
      iVar1 = __cxa_guard_acquire(&cmCMakePathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::subcommand);
      if (iVar1 != 0) {
        local_2e8 = (string_view)cm::operator____s("GET",3);
        local_2f0 = anon_unknown.dwarf_2003e3::HandleGetCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_2d8,(static_string_view *)&local_2e8,&local_2f0)
        ;
        local_300 = (string_view)cm::operator____s("SET",3);
        local_308 = anon_unknown.dwarf_2003e3::HandleSetCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_2c0,(static_string_view *)&local_300,&local_308)
        ;
        local_318 = (string_view)cm::operator____s("APPEND",6);
        local_320 = anon_unknown.dwarf_2003e3::HandleAppendCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_2a8,(static_string_view *)&local_318,&local_320)
        ;
        local_330 = (string_view)cm::operator____s("APPEND_STRING",0xd);
        local_338 = anon_unknown.dwarf_2003e3::HandleAppendStringCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_290,(static_string_view *)&local_330,&local_338)
        ;
        local_348 = (string_view)cm::operator____s("REMOVE_FILENAME",0xf);
        local_350 = anon_unknown.dwarf_2003e3::HandleRemoveFilenameCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_278,(static_string_view *)&local_348,&local_350)
        ;
        local_360 = (string_view)cm::operator____s("REPLACE_FILENAME",0x10);
        local_368 = anon_unknown.dwarf_2003e3::HandleReplaceFilenameCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_260,(static_string_view *)&local_360,&local_368)
        ;
        local_378 = (string_view)cm::operator____s("REMOVE_EXTENSION",0x10);
        local_380 = anon_unknown.dwarf_2003e3::HandleRemoveExtensionCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_248,(static_string_view *)&local_378,&local_380)
        ;
        local_390 = (string_view)cm::operator____s("REPLACE_EXTENSION",0x11);
        local_398 = anon_unknown.dwarf_2003e3::HandleReplaceExtensionCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_230,(static_string_view *)&local_390,&local_398)
        ;
        local_3a8 = (string_view)cm::operator____s("NORMAL_PATH",0xb);
        local_3b0 = anon_unknown.dwarf_2003e3::HandleNormalPathCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_218,(static_string_view *)&local_3a8,&local_3b0)
        ;
        local_3c0 = (string_view)cm::operator____s("RELATIVE_PATH",0xd);
        local_3c8 = anon_unknown.dwarf_2003e3::HandleRelativePathCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_200,(static_string_view *)&local_3c0,&local_3c8)
        ;
        local_3d8 = (string_view)cm::operator____s("ABSOLUTE_PATH",0xd);
        local_3e0 = anon_unknown.dwarf_2003e3::HandleAbsolutePathCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_1e8,(static_string_view *)&local_3d8,&local_3e0)
        ;
        local_3f0 = (string_view)cm::operator____s("NATIVE_PATH",0xb);
        local_3f8 = anon_unknown.dwarf_2003e3::HandleNativePathCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_1d0,(static_string_view *)&local_3f0,&local_3f8)
        ;
        local_408 = (string_view)cm::operator____s("CONVERT",7);
        local_410 = anon_unknown.dwarf_2003e3::HandleConvertCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_1b8,(static_string_view *)&local_408,&local_410)
        ;
        local_420 = (string_view)cm::operator____s("COMPARE",7);
        local_428 = anon_unknown.dwarf_2003e3::HandleCompareCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_1a0,(static_string_view *)&local_420,&local_428)
        ;
        local_438 = (string_view)cm::operator____s("HAS_ROOT_NAME",0xd);
        local_440 = anon_unknown.dwarf_2003e3::HandleHasRootNameCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_188,(static_string_view *)&local_438,&local_440)
        ;
        local_450 = (string_view)cm::operator____s("HAS_ROOT_DIRECTORY",0x12);
        local_458 = anon_unknown.dwarf_2003e3::HandleHasRootDirectoryCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_170,(static_string_view *)&local_450,&local_458)
        ;
        local_468 = (string_view)cm::operator____s("HAS_ROOT_PATH",0xd);
        local_470 = anon_unknown.dwarf_2003e3::HandleHasRootPathCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_158,(static_string_view *)&local_468,&local_470)
        ;
        local_480 = (string_view)cm::operator____s("HAS_FILENAME",0xc);
        local_488 = anon_unknown.dwarf_2003e3::HandleHasFilenameCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_140,(static_string_view *)&local_480,&local_488)
        ;
        local_498 = (string_view)cm::operator____s("HAS_EXTENSION",0xd);
        local_4a0 = anon_unknown.dwarf_2003e3::HandleHasExtensionCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_128,(static_string_view *)&local_498,&local_4a0)
        ;
        local_4b0 = (string_view)cm::operator____s("HAS_STEM",8);
        local_4b8 = anon_unknown.dwarf_2003e3::HandleHasStemCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_110,(static_string_view *)&local_4b0,&local_4b8)
        ;
        local_4c8 = (string_view)cm::operator____s("HAS_RELATIVE_PART",0x11);
        local_4d0 = anon_unknown.dwarf_2003e3::HandleHasRelativePartCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_f8,(static_string_view *)&local_4c8,&local_4d0);
        local_4e0 = (string_view)cm::operator____s("HAS_PARENT_PATH",0xf);
        local_4e8 = anon_unknown.dwarf_2003e3::HandleHasParentPathCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_e0,(static_string_view *)&local_4e0,&local_4e8);
        local_4f8 = (string_view)cm::operator____s("IS_ABSOLUTE",0xb);
        local_500 = anon_unknown.dwarf_2003e3::HandleIsAbsoluteCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_c8,(static_string_view *)&local_4f8,&local_500);
        local_510 = (string_view)cm::operator____s("IS_RELATIVE",0xb);
        local_518 = anon_unknown.dwarf_2003e3::HandleIsRelativeCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_b0,(static_string_view *)&local_510,&local_518);
        local_528 = (string_view)cm::operator____s("IS_PREFIX",9);
        local_530 = anon_unknown.dwarf_2003e3::HandleIsPrefixCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_98,(static_string_view *)&local_528,&local_530);
        local_540 = (string_view)cm::operator____s("HASH",4);
        local_548 = anon_unknown.dwarf_2003e3::HandleHashCommand;
        std::
        pair<cm::static_string_view,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>
        ::pair<cm::static_string_view,_true>(&local_80,(static_string_view *)&local_540,&local_548);
        local_68 = &local_2d8;
        local_60 = 0x1a;
        init._M_len = 0x1a;
        init._M_array = local_68;
        cmSubcommandTable::cmSubcommandTable(&cmCMakePathCommand::subcommand,init);
        __cxa_atexit(cmSubcommandTable::~cmSubcommandTable,&cmCMakePathCommand::subcommand,
                     &__dso_handle);
        __cxa_guard_release(&cmCMakePathCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                             ::subcommand);
      }
    }
    this_00 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)status_local,0);
    key = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    args_local._7_1_ =
         cmSubcommandTable::operator()
                   (&cmCMakePathCommand::subcommand,key,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)status_local,local_20);
  }
  return args_local._7_1_;
}

Assistant:

bool cmCMakePathCommand(std::vector<std::string> const& args,
                        cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("must be called with at least two arguments.");
    return false;
  }

  static cmSubcommandTable const subcommand{
    { "GET"_s, HandleGetCommand },
    { "SET"_s, HandleSetCommand },
    { "APPEND"_s, HandleAppendCommand },
    { "APPEND_STRING"_s, HandleAppendStringCommand },
    { "REMOVE_FILENAME"_s, HandleRemoveFilenameCommand },
    { "REPLACE_FILENAME"_s, HandleReplaceFilenameCommand },
    { "REMOVE_EXTENSION"_s, HandleRemoveExtensionCommand },
    { "REPLACE_EXTENSION"_s, HandleReplaceExtensionCommand },
    { "NORMAL_PATH"_s, HandleNormalPathCommand },
    { "RELATIVE_PATH"_s, HandleRelativePathCommand },
    { "ABSOLUTE_PATH"_s, HandleAbsolutePathCommand },
    { "NATIVE_PATH"_s, HandleNativePathCommand },
    { "CONVERT"_s, HandleConvertCommand },
    { "COMPARE"_s, HandleCompareCommand },
    { "HAS_ROOT_NAME"_s, HandleHasRootNameCommand },
    { "HAS_ROOT_DIRECTORY"_s, HandleHasRootDirectoryCommand },
    { "HAS_ROOT_PATH"_s, HandleHasRootPathCommand },
    { "HAS_FILENAME"_s, HandleHasFilenameCommand },
    { "HAS_EXTENSION"_s, HandleHasExtensionCommand },
    { "HAS_STEM"_s, HandleHasStemCommand },
    { "HAS_RELATIVE_PART"_s, HandleHasRelativePartCommand },
    { "HAS_PARENT_PATH"_s, HandleHasParentPathCommand },
    { "IS_ABSOLUTE"_s, HandleIsAbsoluteCommand },
    { "IS_RELATIVE"_s, HandleIsRelativeCommand },
    { "IS_PREFIX"_s, HandleIsPrefixCommand },
    { "HASH"_s, HandleHashCommand }
  };

  return subcommand(args[0], args, status);
}